

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_in_memory_computer::compute_filtration_t::operator()
          (compute_filtration_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_3)

{
  uint uVar1;
  int iVar2;
  value_t *pvVar3;
  pair<int,_float> *ppVar4;
  ulong uVar5;
  ulong uVar6;
  value_type_conflict2 extraout_XMM0_Da;
  value_type_conflict2 extraout_XMM0_Da_00;
  value_type_conflict2 local_6c;
  directed_flag_complex_cell_t cell;
  directed_flag_complex_boundary_cell_t local_48;
  
  uVar1 = this->current_index + 1;
  this->current_index = uVar1;
  local_6c = 0.0;
  if (this->filtration_algorithm == (filtration_algorithm_t *)0x0) {
    uVar5 = 0;
  }
  else {
    cell._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_00162290;
    uVar1 = size - 2;
    if (uVar1 != cell_hasher_t::dimension) {
      cell_hasher_t::dimension = (unsigned_short)uVar1;
    }
    cell.vertices = first_vertex;
    iVar2 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar2 == '\0') {
      (*this->filtration_algorithm->_vptr_filtration_algorithm_t[2])
                (this->filtration_algorithm,(ulong)(size - 1U & 0xffff),&cell,this->graph,0);
      local_6c = extraout_XMM0_Da;
    }
    else {
      pvVar3 = this->boundary_filtration;
      if (pvVar3 == (value_t *)0x0) {
        uVar5 = 0xffffffffffffffff;
        if (-1 < size) {
          uVar5 = (ulong)(uint)size << 2;
        }
        pvVar3 = (value_t *)operator_new__(uVar5);
        this->boundary_filtration = pvVar3;
      }
      uVar6 = 0;
      uVar5 = 0;
      if (0 < size) {
        uVar5 = (ulong)(uint)size;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        local_48.super_directed_flag_complex_cell_t.vertices = cell.vertices;
        local_48.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
             (_func_int **)&PTR_vertex_001622a8;
        local_48.i = uVar6;
        ppVar4 = directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
                 get_data<directed_flag_complex_boundary_cell_t>(this->complex,uVar1,&local_48);
        pvVar3 = this->boundary_filtration;
        pvVar3[uVar6] = ppVar4->second;
      }
      (*this->filtration_algorithm->_vptr_filtration_algorithm_t[2])
                (this->filtration_algorithm,(ulong)(size - 1U & 0xffff),&cell,this->graph,pvVar3);
      local_6c = extraout_XMM0_Da_00;
    }
    std::vector<float,_std::allocator<float>_>::push_back(&this->next_filtration,&local_6c);
    uVar1 = this->current_index;
    uVar5 = (ulong)(uint)local_6c << 0x20;
  }
  directed_flag_complex_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
            ((directed_flag_complex_in_memory_t<std::pair<int,float>> *)this->complex,size + -1,
             first_vertex,(pair<int,_float>)(uVar1 | uVar5));
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;

		value_t nf = 0.0f;

		if (filtration_algorithm != nullptr) {
			directed_flag_complex_cell_t cell(first_vertex);
			if (cell_hasher_t::dimension != size - 2) cell_hasher_t::set_current_cell_dimension(size - 2);

			if (filtration_algorithm->needs_face_filtration()) {
				if (boundary_filtration == nullptr) boundary_filtration = new value_t[size];

				for (int i = 0; i < size; i++) {
					boundary_filtration[i] = complex.get_data(size - 2, cell.boundary(i)).second;
				}

				nf = filtration_algorithm->compute_filtration(size - 1, cell, graph, boundary_filtration);
			} else {
				nf = filtration_algorithm->compute_filtration(size - 1, cell, graph, nullptr);
			}
			next_filtration.push_back(nf);
		}
		complex.set_data(size - 1, first_vertex, std::make_pair(current_index, nf));
	}